

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O1

xmlChar * htmlParseHTMLAttribute(htmlParserCtxtPtr ctxt,xmlChar stop)

{
  bool bVar1;
  uint uVar2;
  byte *pbVar3;
  htmlEntityDesc *phVar4;
  byte *pbVar5;
  int iVar6;
  byte bVar7;
  byte *pbVar8;
  byte *pbVar9;
  byte *pbVar10;
  ulong uVar11;
  undefined7 in_register_00000031;
  int iVar12;
  bool bVar13;
  xmlChar *name;
  int l;
  byte *local_40;
  uint local_38;
  int local_34;
  
  uVar11 = CONCAT71(in_register_00000031,stop) & 0xffffffff;
  local_40 = (byte *)0x0;
  pbVar3 = (byte *)(*xmlMallocAtomic)(100);
  if (pbVar3 == (byte *)0x0) {
    htmlErrMemory(ctxt,"buffer allocation failed\n");
LAB_00150022:
    pbVar3 = (byte *)0x0;
  }
  else {
    pbVar9 = ctxt->input->cur;
    bVar7 = *pbVar9;
    pbVar10 = pbVar3;
    if (bVar7 != (byte)uVar11 && bVar7 != 0) {
      iVar12 = 100;
      local_38 = (uint)CONCAT71(in_register_00000031,stop);
      pbVar8 = pbVar3;
      while( true ) {
        pbVar3 = pbVar8;
        if (((char)uVar11 == '\0') && (bVar7 == 0x3e)) break;
        if ((char)uVar11 == '\0') {
          if (bVar7 < 0x27) {
            if ((ulong)bVar7 == 0x26) goto LAB_00150076;
            if ((0x100002600U >> ((ulong)bVar7 & 0x3f) & 1) != 0) break;
          }
LAB_0015020d:
          pbVar9 = pbVar10;
          if ((long)(iVar12 + -100) < (long)pbVar10 - (long)pbVar8) {
            iVar12 = iVar12 * 2;
            pbVar5 = (byte *)(*xmlRealloc)(pbVar8,(long)iVar12);
            pbVar3 = pbVar5;
            if (pbVar5 == (byte *)0x0) {
              htmlErrMemory(ctxt,"growing buffer\n");
              (*xmlFree)(pbVar8);
              pbVar3 = pbVar8;
            }
            pbVar9 = pbVar3 + (int)((long)pbVar10 - (long)pbVar8);
            if (pbVar5 == (byte *)0x0) {
              bVar13 = false;
              goto joined_r0x001502df;
            }
          }
          uVar2 = htmlCurrentChar(ctxt,&local_34);
          if (uVar2 < 0x80) {
            iVar6 = -6;
            bVar7 = (byte)uVar2;
          }
          else if (uVar2 < 0x800) {
            bVar7 = (byte)(uVar2 >> 6) | 0xc0;
            iVar6 = 0;
          }
          else if (uVar2 < 0x10000) {
            bVar7 = (byte)(uVar2 >> 0xc) | 0xe0;
            iVar6 = 6;
          }
          else {
            bVar7 = (byte)(uVar2 >> 0x12) & 7 | 0xf0;
            iVar6 = 0xc;
          }
          pbVar10 = pbVar9 + 1;
          *pbVar9 = bVar7;
          if (0x7f < uVar2) {
            do {
              *pbVar10 = (byte)(uVar2 >> ((byte)iVar6 & 0x1f)) & 0x3f | 0x80;
              pbVar10 = pbVar10 + 1;
              bVar13 = 5 < iVar6;
              iVar6 = iVar6 + -6;
            } while (bVar13);
          }
          xmlNextChar(ctxt);
          bVar13 = true;
joined_r0x001502df:
          if (!bVar13) goto LAB_00150022;
        }
        else {
          if (bVar7 != 0x26) goto LAB_0015020d;
LAB_00150076:
          if (pbVar9[1] == 0x23) {
            uVar2 = htmlParseCharRef(ctxt);
            if (uVar2 < 0x80) {
              iVar6 = -6;
              bVar7 = (byte)uVar2;
            }
            else if (uVar2 < 0x800) {
              bVar7 = (byte)(uVar2 >> 6) | 0xc0;
              iVar6 = 0;
            }
            else if (uVar2 < 0x10000) {
              bVar7 = (byte)(uVar2 >> 0xc) | 0xe0;
              iVar6 = 6;
            }
            else {
              bVar7 = (byte)(uVar2 >> 0x12) & 7 | 0xf0;
              iVar6 = 0xc;
            }
            pbVar9 = pbVar10 + 1;
            *pbVar10 = bVar7;
            if (0x7f < uVar2) {
              do {
                *pbVar9 = (byte)(uVar2 >> ((byte)iVar6 & 0x1f)) & 0x3f | 0x80;
                pbVar9 = pbVar9 + 1;
                bVar13 = 5 < iVar6;
                iVar6 = iVar6 + -6;
              } while (bVar13);
            }
            bVar13 = true;
            pbVar10 = pbVar9;
            if ((long)(iVar12 + -100) < (long)pbVar9 - (long)pbVar8) {
              iVar12 = iVar12 * 2;
              pbVar5 = (byte *)(*xmlRealloc)(pbVar8,(long)iVar12);
              bVar13 = pbVar5 != (byte *)0x0;
              pbVar3 = pbVar5;
              if (!bVar13) {
                htmlErrMemory(ctxt,"growing buffer\n");
                (*xmlFree)(pbVar8);
                pbVar3 = pbVar8;
              }
              if (pbVar5 != (byte *)0x0) {
                pbVar10 = pbVar3 + (int)((long)pbVar9 - (long)pbVar8);
              }
            }
            goto joined_r0x001502df;
          }
          phVar4 = htmlParseEntityRef(ctxt,&local_40);
          if (local_40 == (byte *)0x0) {
            *pbVar10 = 0x26;
            pbVar10 = pbVar10 + 1;
            if ((long)(iVar12 + -100) < (long)pbVar10 - (long)pbVar8) {
              iVar12 = iVar12 * 2;
              pbVar9 = (byte *)(*xmlRealloc)(pbVar8,(long)iVar12);
              pbVar3 = pbVar9;
              if (pbVar9 == (byte *)0x0) {
                htmlErrMemory(ctxt,"growing buffer\n");
                (*xmlFree)(pbVar8);
                pbVar3 = pbVar8;
              }
              pbVar10 = pbVar3 + (int)((long)pbVar10 - (long)pbVar8);
              if (pbVar9 == (byte *)0x0) goto LAB_00150022;
            }
          }
          else {
            if (phVar4 != (htmlEntityDesc *)0x0) {
              pbVar9 = pbVar10;
              if ((long)(iVar12 + -100) < (long)pbVar10 - (long)pbVar8) {
                iVar12 = iVar12 * 2;
                pbVar5 = (byte *)(*xmlRealloc)(pbVar8,(long)iVar12);
                pbVar3 = pbVar5;
                if (pbVar5 == (byte *)0x0) {
                  htmlErrMemory(ctxt,"growing buffer\n");
                  (*xmlFree)(pbVar8);
                  pbVar3 = pbVar8;
                }
                pbVar9 = pbVar3 + (int)((long)pbVar10 - (long)pbVar8);
                if (pbVar5 == (byte *)0x0) {
                  bVar13 = false;
                  goto joined_r0x001502df;
                }
              }
              uVar2 = phVar4->value;
              if (uVar2 < 0x80) {
                iVar6 = -6;
                bVar7 = (byte)uVar2;
              }
              else if (uVar2 < 0x800) {
                bVar7 = (byte)(uVar2 >> 6) | 0xc0;
                iVar6 = 0;
              }
              else if (uVar2 < 0x10000) {
                bVar7 = (byte)(uVar2 >> 0xc) | 0xe0;
                iVar6 = 6;
              }
              else {
                bVar7 = (byte)(uVar2 >> 0x12) & 7 | 0xf0;
                iVar6 = 0xc;
              }
              pbVar10 = pbVar9 + 1;
              *pbVar9 = bVar7;
              bVar13 = true;
              if (0x7f < uVar2) {
                do {
                  *pbVar10 = (byte)(uVar2 >> ((byte)iVar6 & 0x1f)) & 0x3f | 0x80;
                  pbVar10 = pbVar10 + 1;
                  bVar1 = 5 < iVar6;
                  iVar6 = iVar6 + -6;
                } while (bVar1);
              }
              goto joined_r0x001502df;
            }
            *pbVar10 = 0x26;
            bVar7 = *local_40;
            pbVar9 = local_40;
            while (pbVar10 = pbVar10 + 1, pbVar3 = pbVar8, bVar7 != 0) {
              if ((long)(iVar12 + -100) < (long)pbVar10 - (long)pbVar8) {
                iVar12 = iVar12 * 2;
                pbVar5 = (byte *)(*xmlRealloc)(pbVar8,(long)iVar12);
                pbVar3 = pbVar5;
                if (pbVar5 == (byte *)0x0) {
                  htmlErrMemory(ctxt,"growing buffer\n");
                  (*xmlFree)(pbVar8);
                  pbVar3 = pbVar8;
                }
                pbVar10 = pbVar3 + (int)((long)pbVar10 - (long)pbVar8);
                if (pbVar5 == (byte *)0x0) goto LAB_00150022;
              }
              *pbVar10 = *pbVar9;
              bVar7 = pbVar9[1];
              pbVar8 = pbVar3;
              pbVar9 = pbVar9 + 1;
            }
          }
        }
        pbVar9 = ctxt->input->cur;
        bVar7 = *pbVar9;
        if ((bVar7 == 0) || (uVar11 = (ulong)local_38, pbVar8 = pbVar3, bVar7 == (byte)local_38))
        break;
      }
    }
    *pbVar10 = 0;
  }
  return pbVar3;
}

Assistant:

static xmlChar *
htmlParseHTMLAttribute(htmlParserCtxtPtr ctxt, const xmlChar stop) {
    xmlChar *buffer = NULL;
    int buffer_size = 0;
    xmlChar *out = NULL;
    const xmlChar *name = NULL;
    const xmlChar *cur = NULL;
    const htmlEntityDesc * ent;

    /*
     * allocate a translation buffer.
     */
    buffer_size = HTML_PARSER_BUFFER_SIZE;
    buffer = (xmlChar *) xmlMallocAtomic(buffer_size);
    if (buffer == NULL) {
	htmlErrMemory(ctxt, "buffer allocation failed\n");
	return(NULL);
    }
    out = buffer;

    /*
     * Ok loop until we reach one of the ending chars
     */
    while ((CUR != 0) && (CUR != stop)) {
	if ((stop == 0) && (CUR == '>')) break;
	if ((stop == 0) && (IS_BLANK_CH(CUR))) break;
        if (CUR == '&') {
	    if (NXT(1) == '#') {
		unsigned int c;
		int bits;

		c = htmlParseCharRef(ctxt);
		if      (c <    0x80)
		        { *out++  = c;                bits= -6; }
		else if (c <   0x800)
		        { *out++  =((c >>  6) & 0x1F) | 0xC0;  bits=  0; }
		else if (c < 0x10000)
		        { *out++  =((c >> 12) & 0x0F) | 0xE0;  bits=  6; }
		else
		        { *out++  =((c >> 18) & 0x07) | 0xF0;  bits= 12; }

		for ( ; bits >= 0; bits-= 6) {
		    *out++  = ((c >> bits) & 0x3F) | 0x80;
		}

		if (out - buffer > buffer_size - 100) {
			int indx = out - buffer;

			growBuffer(buffer);
			out = &buffer[indx];
		}
	    } else {
		ent = htmlParseEntityRef(ctxt, &name);
		if (name == NULL) {
		    *out++ = '&';
		    if (out - buffer > buffer_size - 100) {
			int indx = out - buffer;

			growBuffer(buffer);
			out = &buffer[indx];
		    }
		} else if (ent == NULL) {
		    *out++ = '&';
		    cur = name;
		    while (*cur != 0) {
			if (out - buffer > buffer_size - 100) {
			    int indx = out - buffer;

			    growBuffer(buffer);
			    out = &buffer[indx];
			}
			*out++ = *cur++;
		    }
		} else {
		    unsigned int c;
		    int bits;

		    if (out - buffer > buffer_size - 100) {
			int indx = out - buffer;

			growBuffer(buffer);
			out = &buffer[indx];
		    }
		    c = ent->value;
		    if      (c <    0x80)
			{ *out++  = c;                bits= -6; }
		    else if (c <   0x800)
			{ *out++  =((c >>  6) & 0x1F) | 0xC0;  bits=  0; }
		    else if (c < 0x10000)
			{ *out++  =((c >> 12) & 0x0F) | 0xE0;  bits=  6; }
		    else
			{ *out++  =((c >> 18) & 0x07) | 0xF0;  bits= 12; }

		    for ( ; bits >= 0; bits-= 6) {
			*out++  = ((c >> bits) & 0x3F) | 0x80;
		    }
		}
	    }
	} else {
	    unsigned int c;
	    int bits, l;

	    if (out - buffer > buffer_size - 100) {
		int indx = out - buffer;

		growBuffer(buffer);
		out = &buffer[indx];
	    }
	    c = CUR_CHAR(l);
	    if      (c <    0x80)
		    { *out++  = c;                bits= -6; }
	    else if (c <   0x800)
		    { *out++  =((c >>  6) & 0x1F) | 0xC0;  bits=  0; }
	    else if (c < 0x10000)
		    { *out++  =((c >> 12) & 0x0F) | 0xE0;  bits=  6; }
	    else
		    { *out++  =((c >> 18) & 0x07) | 0xF0;  bits= 12; }

	    for ( ; bits >= 0; bits-= 6) {
		*out++  = ((c >> bits) & 0x3F) | 0x80;
	    }
	    NEXT;
	}
    }
    *out = 0;
    return(buffer);
}